

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::updateExtensionBehavior
          (TParseVersions *this,char *extension,TExtensionBehavior behavior)

{
  int iVar1;
  iterator iVar2;
  TSourceLoc *pTVar3;
  _Rb_tree_node_base *p_Var4;
  pool_allocator<char> local_58;
  key_type local_50;
  
  iVar1 = strcmp(extension,"all");
  if (iVar1 == 0) {
    if (behavior - EBhRequire < 2) {
      pTVar3 = getCurrentLoc(this);
      (*this->_vptr_TParseVersions[0x2d])
                (this,pTVar3,"extension \'all\' cannot have \'require\' or \'enable\' behavior",
                 "#extension","",this->_vptr_TParseVersions[0x2d]);
      return;
    }
    for (p_Var4 = (this->extensionBehavior).
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(this->extensionBehavior).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
         ._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      *(TExtensionBehavior *)&p_Var4[2]._M_parent = behavior;
    }
  }
  else {
    local_58.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
               extension,&local_58);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
                    *)&this->extensionBehavior,&local_50);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->extensionBehavior).
         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior>_>_>
         ._M_t._M_impl.super__Rb_tree_header) {
      if (behavior - EBhEnable < 3) {
        pTVar3 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2e])
                  (this,pTVar3,"extension not supported:","#extension",extension);
      }
      else {
        if (behavior != EBhRequire) {
          __assert_fail("0 && \"unexpected behavior\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Versions.cpp"
                        ,0x452,
                        "virtual void glslang::TParseVersions::updateExtensionBehavior(const char *, TExtensionBehavior)"
                       );
        }
        pTVar3 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2d])
                  (this,pTVar3,"extension not supported:","#extension",extension);
      }
    }
    else {
      if (*(int *)&iVar2._M_node[2]._M_parent == 5) {
        pTVar3 = getCurrentLoc(this);
        (*this->_vptr_TParseVersions[0x2e])
                  (this,pTVar3,"extension is only partially supported:","#extension",extension);
      }
      if (behavior != EBhDisable) {
        TIntermediate::addRequestedExtension(this->intermediate,extension);
      }
      *(TExtensionBehavior *)&iVar2._M_node[2]._M_parent = behavior;
    }
  }
  return;
}

Assistant:

void TParseVersions::updateExtensionBehavior(const char* extension, TExtensionBehavior behavior)
{
    // Update the current behavior
    if (strcmp(extension, "all") == 0) {
        // special case for the 'all' extension; apply it to every extension present
        if (behavior == EBhRequire || behavior == EBhEnable) {
            error(getCurrentLoc(), "extension 'all' cannot have 'require' or 'enable' behavior", "#extension", "");
            return;
        } else {
            for (auto iter = extensionBehavior.begin(); iter != extensionBehavior.end(); ++iter)
                iter->second = behavior;
        }
    } else {
        // Do the update for this single extension
        auto iter = extensionBehavior.find(TString(extension));
        if (iter == extensionBehavior.end()) {
            switch (behavior) {
            case EBhRequire:
                error(getCurrentLoc(), "extension not supported:", "#extension", extension);
                break;
            case EBhEnable:
            case EBhWarn:
            case EBhDisable:
                warn(getCurrentLoc(), "extension not supported:", "#extension", extension);
                break;
            default:
                assert(0 && "unexpected behavior");
            }

            return;
        } else {
            if (iter->second == EBhDisablePartial)
                warn(getCurrentLoc(), "extension is only partially supported:", "#extension", extension);
            if (behavior != EBhDisable)
                intermediate.addRequestedExtension(extension);
            iter->second = behavior;
        }
    }
}